

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)8>_> *
vkt::pipeline::anon_unknown_0::createBufferAndBindMemory
          (Move<vk::Handle<(vk::HandleType)8>_> *__return_storage_ptr__,Context *context,
          VkDeviceSize size,VkBufferUsageFlags usage,
          MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *pAlloc)

{
  deUint64 dVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  VkResult result;
  DeviceInterface *vk_00;
  VkDevice device;
  MovePtr *this;
  Handle<(vk::HandleType)8> *pHVar2;
  Allocation *pAVar3;
  VkDeviceMemory VVar4;
  VkDeviceSize VVar5;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined8 in_stack_fffffffffffffec0;
  VkMemoryRequirements local_d0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_a8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_98;
  undefined1 local_81;
  undefined1 local_80 [8];
  VkBufferCreateInfo vertexBufferParams;
  deUint32 queueFamilyIndex;
  VkDevice vkDevice;
  DeviceInterface *vk;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *pAlloc_local;
  VkBufferUsageFlags usage_local;
  VkDeviceSize size_local;
  Context *context_local;
  Move<vk::Handle<(vk::HandleType)8>_> *vertexBuffer;
  
  vk_00 = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  vertexBufferParams.pQueueFamilyIndices._4_4_ = Context::getUniversalQueueFamilyIndex(context);
  local_80._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  vertexBufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexBufferParams._4_4_ = 0;
  vertexBufferParams.pNext._0_4_ = 0;
  vertexBufferParams.size._4_4_ = 0;
  vertexBufferParams.usage = 1;
  vertexBufferParams._40_8_ = (long)&vertexBufferParams.pQueueFamilyIndices + 4;
  local_81 = 0;
  vertexBufferParams._16_8_ = size;
  vertexBufferParams.size._0_4_ = usage;
  ::vk::createBuffer(__return_storage_ptr__,vk_00,device,(VkBufferCreateInfo *)local_80,
                     (VkAllocationCallbacks *)0x0);
  this = (MovePtr *)Context::getDefaultAllocator(context);
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  ::vk::getBufferMemoryRequirements(&local_d0,vk_00,device,(VkBuffer)pHVar2->m_internal);
  (*(*(_func_int ***)this)[3])(&local_a8,this,&local_d0,(ulong)::vk::MemoryRequirement::HostVisible)
  ;
  local_98 = de::details::MovePtr::operator_cast_to_PtrData(&local_a8,this);
  data.ptr._4_4_ = in_stack_fffffffffffffebc;
  data.ptr._0_4_ = in_stack_fffffffffffffeb8;
  data._8_8_ = in_stack_fffffffffffffec0;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=(pAlloc,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_a8);
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  dVar1 = pHVar2->m_internal;
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&pAlloc->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                     );
  VVar4 = ::vk::Allocation::getMemory(pAVar3);
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&pAlloc->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                     );
  VVar5 = ::vk::Allocation::getOffset(pAVar3);
  result = (*vk_00->_vptr_DeviceInterface[0xc])(vk_00,device,dVar1,VVar4.m_internal,VVar5);
  ::vk::checkResult(result,
                    "vk.bindBufferMemory(vkDevice, *vertexBuffer, (*pAlloc)->getMemory(), (*pAlloc)->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x1ca);
  return __return_storage_ptr__;
}

Assistant:

Move<VkBuffer> createBufferAndBindMemory (Context& context, VkDeviceSize size, VkBufferUsageFlags usage, de::MovePtr<Allocation>* pAlloc)
{
	const DeviceInterface&  vk               = context.getDeviceInterface();
	const VkDevice          vkDevice         = context.getDevice();
	const deUint32          queueFamilyIndex = context.getUniversalQueueFamilyIndex();

	const VkBufferCreateInfo vertexBufferParams =
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,       // VkStructureType      sType;
		DE_NULL,                                    // const void*          pNext;
		0u,                                         // VkBufferCreateFlags  flags;
		size,                                       // VkDeviceSize         size;
		usage,                                      // VkBufferUsageFlags   usage;
		VK_SHARING_MODE_EXCLUSIVE,                  // VkSharingMode        sharingMode;
		1u,                                         // deUint32             queueFamilyCount;
		&queueFamilyIndex                           // const deUint32*      pQueueFamilyIndices;
	};

	Move<VkBuffer> vertexBuffer = createBuffer(vk, vkDevice, &vertexBufferParams);

	*pAlloc = context.getDefaultAllocator().allocate(getBufferMemoryRequirements(vk, vkDevice, *vertexBuffer), MemoryRequirement::HostVisible);
	VK_CHECK(vk.bindBufferMemory(vkDevice, *vertexBuffer, (*pAlloc)->getMemory(), (*pAlloc)->getOffset()));

	return vertexBuffer;
}